

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.h
# Opt level: O1

uchar * append_uint64(uchar *cp,uint64_t i)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uchar *puVar3;
  byte *pbVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (i >> 0x20 == 0) {
    puVar3 = append_uint32(cp,(uint32_t)i);
    return puVar3;
  }
  uVar9 = i % 1000000000;
  if (i < 0xde0b6b3e2feca00) {
    pbVar4 = append_uint32(cp,(uint32_t)(i / 1000000000));
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = i >> 0x12;
    pbVar4 = append_uint32(cp,SUB164(auVar1 * ZEXT816(0x49c97747490f),8) >> 0x18);
    uVar8 = (i / 1000000000) % 1000000000;
    bVar6 = (byte)(uVar8 / 100000000);
    *pbVar4 = bVar6 | 0x30;
    uVar7 = (int)uVar8 + (uint)bVar6 * -100000000;
    uVar8 = (ulong)uVar7 * 0x6b5fca7;
    pbVar4[1] = (byte)(uVar8 >> 0x32) | 0x30;
    uVar7 = uVar7 + (uint)(uVar8 >> 0x32) * -10000000;
    uVar2 = (uint)((ulong)uVar7 * 0x10c6f7b >> 0x20);
    pbVar4[2] = (char)(uVar2 >> 0xc) + 0x30;
    uVar7 = uVar7 + (uVar2 >> 0xc) * -1000000;
    uVar8 = (ulong)uVar7 * 0xa7c5b;
    pbVar4[3] = (byte)(uVar8 >> 0x24) | 0x30;
    uVar7 = uVar7 + (uint)(uVar8 >> 0x24) * -100000;
    lVar5 = (ulong)uVar7 * 0x68db9;
    pbVar4[4] = (byte)((ulong)lVar5 >> 0x20) | 0x30;
    uVar7 = uVar7 + (int)((ulong)lVar5 >> 0x20) * -10000;
    lVar5 = (ulong)uVar7 * 0x418938;
    pbVar4[5] = (char)((ulong)lVar5 >> 0x20) + 0x30;
    uVar7 = uVar7 + (int)((ulong)lVar5 >> 0x20) * -1000;
    lVar5 = (ulong)uVar7 * 0x28f5c29;
    pbVar4[6] = (byte)((ulong)lVar5 >> 0x20) | 0x30;
    uVar7 = uVar7 + (int)((ulong)lVar5 >> 0x20) * -100;
    bVar6 = (byte)((ulong)uVar7 * 0x1999999a >> 0x20);
    pbVar4[7] = bVar6 | 0x30;
    pbVar4[8] = (char)uVar7 + bVar6 * -10 | 0x30;
    pbVar4 = pbVar4 + 9;
  }
  *pbVar4 = (byte)(uVar9 / 100000000) | 0x30;
  uVar7 = (int)uVar9 + (int)(uVar9 / 100000000) * -100000000;
  uVar9 = (ulong)uVar7 * 0x6b5fca7;
  pbVar4[1] = (byte)(uVar9 >> 0x32) | 0x30;
  uVar7 = uVar7 + (uint)(uVar9 >> 0x32) * -10000000;
  uVar2 = (uint)((ulong)uVar7 * 0x10c6f7b >> 0x20);
  pbVar4[2] = (char)(uVar2 >> 0xc) + 0x30;
  uVar7 = uVar7 + (uVar2 >> 0xc) * -1000000;
  uVar9 = (ulong)uVar7 * 0xa7c5b;
  pbVar4[3] = (byte)(uVar9 >> 0x24) | 0x30;
  uVar7 = uVar7 + (uint)(uVar9 >> 0x24) * -100000;
  lVar5 = (ulong)uVar7 * 0x68db9;
  pbVar4[4] = (byte)((ulong)lVar5 >> 0x20) | 0x30;
  uVar7 = uVar7 + (int)((ulong)lVar5 >> 0x20) * -10000;
  lVar5 = (ulong)uVar7 * 0x418938;
  pbVar4[5] = (char)((ulong)lVar5 >> 0x20) + 0x30;
  uVar7 = uVar7 + (int)((ulong)lVar5 >> 0x20) * -1000;
  lVar5 = (ulong)uVar7 * 0x28f5c29;
  pbVar4[6] = (byte)((ulong)lVar5 >> 0x20) | 0x30;
  uVar7 = uVar7 + (int)((ulong)lVar5 >> 0x20) * -100;
  bVar6 = (byte)((ulong)uVar7 * 0x1999999a >> 0x20);
  pbVar4[7] = bVar6 | 0x30;
  pbVar4[8] = (char)uVar7 + bVar6 * -10 | 0x30;
  return pbVar4 + 9;
}

Assistant:

static inline unsigned char *append_uint64(unsigned char *cp, uint64_t i) {
    uint64_t j;

    if (i <= 0xffffffff)
	return append_uint32(cp, i);

    if ((j = i/1000000000) > 1000000000) {
	cp = append_uint32(cp, j/1000000000);
	j %= 1000000000;
	cp = append_sub32(cp, j);
    } else {
	cp = append_uint32(cp, i / 1000000000);
    }
    cp = append_sub32(cp, i % 1000000000);

    return cp;
}